

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O2

EncodingResult<kj::Array<unsigned_char>_> * __thiscall
kj::decodeBase64(EncodingResult<kj::Array<unsigned_char>_> *__return_storage_ptr__,kj *this,
                ArrayPtr<const_char> input)

{
  kj kVar1;
  char cVar2;
  byte bVar3;
  byte bVar4;
  byte *pbVar5;
  byte *pbVar6;
  bool bVar7;
  kj *pkVar8;
  ulong uVar9;
  kj *pkVar10;
  bool bVar11;
  ulong count;
  kj *pkVar12;
  Array<unsigned_char> output;
  Array<unsigned_char> copy;
  Array<unsigned_char> local_68;
  byte *local_50;
  Array<unsigned_char> local_48;
  
  count = (long)input.ptr * 6 + 7U >> 3;
  local_68.ptr = _::HeapArrayDisposer::allocate<unsigned_char>(count);
  local_68.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pkVar8 = this + (int)input.ptr;
  uVar9 = 0;
  bVar7 = false;
  pbVar5 = local_68.ptr;
  do {
    do {
      pbVar6 = pbVar5;
      if (this == pkVar8) {
LAB_0016f648:
        uVar9 = (ulong)((int)pbVar6 - (int)local_68.ptr);
        local_68.size_ = count;
        if (uVar9 < count) {
          local_48.ptr = _::HeapArrayDisposer::allocate<unsigned_char>(uVar9);
          local_48.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
          local_48.size_ = uVar9;
          memcpy(local_48.ptr,local_68.ptr,uVar9);
          Array<unsigned_char>::operator=(&local_68,&local_48);
          Array<unsigned_char>::~Array(&local_48);
        }
        (__return_storage_ptr__->super_Array<unsigned_char>).ptr = local_68.ptr;
        (__return_storage_ptr__->super_Array<unsigned_char>).size_ = local_68.size_;
        (__return_storage_ptr__->super_Array<unsigned_char>).disposer = local_68.disposer;
        local_68.ptr = (uchar *)0x0;
        local_68.size_ = 0;
        __return_storage_ptr__->hadErrors = bVar7;
        Array<unsigned_char>::~Array(&local_68);
        return __return_storage_ptr__;
      }
      kVar1 = *this;
      this = this + 1;
      cVar2 = (anonymous_namespace)::base64_decode_value(char)::decoding[(byte)kVar1];
      bVar11 = (bool)(cVar2 < -1 | bVar7);
      bVar7 = (bool)(cVar2 < -1 | bVar7);
    } while (cVar2 < '\0');
    *pbVar5 = cVar2 << 2;
    do {
      if (this == pkVar8) {
        bVar7 = true;
        goto LAB_0016f648;
      }
      kVar1 = *this;
      this = this + 1;
      bVar3 = (anonymous_namespace)::base64_decode_value(char)::decoding[(byte)kVar1];
      bVar11 = (bool)(bVar11 | (char)bVar3 < -1);
    } while ((char)bVar3 < '\0');
    local_50 = pbVar5 + 1;
    *pbVar5 = cVar2 << 2 | bVar3 >> 4 & 3;
    pbVar5[1] = bVar3 << 4;
    do {
      while( true ) {
        while( true ) {
          pkVar12 = this;
          if (pkVar12 == pkVar8) {
            bVar7 = (bool)(bVar11 | uVar9 == 1);
            pbVar6 = local_50;
            goto LAB_0016f648;
          }
          bVar4 = (anonymous_namespace)::base64_decode_value(char)::decoding[(byte)*pkVar12];
          bVar7 = (bool)(bVar11 | (char)bVar4 < -2);
          this = pkVar12 + 1;
          if (bVar11 == false && (char)bVar4 >= -2) break;
          bVar11 = bVar7;
          if (-1 < (char)bVar4) {
            bVar7 = true;
            goto LAB_0016f58f;
          }
        }
        if (*pkVar12 == (kj)0x3d) break;
        bVar11 = bVar7;
        if (-1 < (char)bVar4) goto LAB_0016f583;
      }
      uVar9 = uVar9 + 1;
      bVar11 = 2 < uVar9;
      this = pkVar12 + 1;
    } while ((char)bVar4 < '\0');
    bVar7 = true;
    if (uVar9 < 3) {
LAB_0016f583:
      bVar7 = uVar9 != 0;
    }
LAB_0016f58f:
    pbVar6 = pbVar5 + 2;
    pbVar5[1] = bVar3 << 4 | bVar4 >> 2 & 0xf;
    pbVar5[2] = bVar4 << 6;
    pkVar12 = pkVar12 + 1;
    do {
      while( true ) {
        while( true ) {
          pkVar10 = pkVar12;
          if (pkVar10 == pkVar8) goto LAB_0016f648;
          bVar3 = (anonymous_namespace)::base64_decode_value(char)::decoding[(byte)*pkVar10];
          pkVar12 = pkVar10 + 1;
          if ((bVar7 == false) && (-3 < (char)bVar3)) break;
          bVar7 = true;
          if (-1 < (char)bVar3) goto LAB_0016f611;
        }
        if (*pkVar10 == (kj)0x3d) break;
        bVar7 = false;
        if (-1 < (char)bVar3) goto LAB_0016f60a;
      }
      uVar9 = uVar9 + 1;
      bVar7 = 1 < uVar9;
      pkVar12 = pkVar10 + 1;
    } while ((char)bVar3 < '\0');
    bVar7 = true;
    if (uVar9 < 2) {
LAB_0016f60a:
      bVar7 = uVar9 != 0;
    }
LAB_0016f611:
    pbVar5[2] = bVar4 << 6 | bVar3 & 0x3f;
    pbVar5 = pbVar5 + 3;
    this = pkVar10 + 1;
  } while( true );
}

Assistant:

EncodingResult<Array<byte>> decodeBase64(ArrayPtr<const char> input) {
  base64_decodestate state;

  auto output = heapArray<byte>((input.size() * 6 + 7) / 8);

  size_t n = base64_decode_block(input.begin(), input.size(),
      reinterpret_cast<char*>(output.begin()), &state);

  if (n < output.size()) {
    auto copy = heapArray<byte>(n);
    memcpy(copy.begin(), output.begin(), n);
    output = kj::mv(copy);
  }

  return EncodingResult<Array<byte>>(kj::mv(output), state.hadErrors);
}